

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O0

ListNode * ListTail(LinkedList *list)

{
  LinkedList *list_local;
  
  if (list != (LinkedList *)0x0) {
    if (list == (LinkedList *)0x0) {
      list_local = (LinkedList *)0x0;
    }
    else if (list->size == 0) {
      list_local = (LinkedList *)0x0;
    }
    else {
      list_local = (LinkedList *)(list->tail).prev;
    }
    return &list_local->head;
  }
  __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0xeb,
                "ListNode *ListTail(LinkedList *)");
}

Assistant:

ListNode *ListTail(LinkedList *list)
{
	assert(list != NULL);

	if (!list)
		return NULL;

	if (!list->size)
		return NULL;
	else
		return list->tail.prev;
}